

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExpressionNode * __thiscall DL::Parser::gr_expression(Parser *this)

{
  ExpressionNode *this_00;
  undefined1 auStack_48 [40];
  
  this_00 = (ExpressionNode *)operator_new(0x38);
  (this_00->Name)._M_dataplus._M_p = (pointer)&(this_00->Name).field_2;
  (this_00->Name)._M_string_length = 0;
  (this_00->Name).field_2._M_local_buf[0] = '\0';
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match((Token *)auStack_48,this,T_Identifier);
  std::__cxx11::string::operator=((string *)this_00,(string *)(auStack_48 + 8));
  std::__cxx11::string::~string((string *)(auStack_48 + 8));
  gr_data_list((vector_t<DataNode_*> *)auStack_48,this);
  std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::_M_move_assign
            (&this_00->Nodes,auStack_48);
  std::_Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::~_Vector_base
            ((_Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_> *)auStack_48);
  return this_00;
}

Assistant:

ExpressionNode* Parser::gr_expression()
{
	ExpressionNode* node = new ExpressionNode;

	node->Name  = match(T_Identifier).Value;
	node->Nodes = gr_data_list();
	return node;
}